

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_rgb2rgba(Mat *m,uchar *rgba,int stride)

{
  float *pfVar1;
  int *piVar2;
  int in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  int remain;
  int y;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  int local_13c [3];
  int local_130;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  Mat local_110;
  float *local_c8;
  Mat local_c0;
  float *local_78;
  Mat local_70;
  float *local_28;
  int local_20;
  int local_1c;
  int local_18;
  undefined1 *local_10;
  
  local_18 = *(int *)(in_RDI + 0x2c);
  local_1c = *(int *)(in_RDI + 0x30);
  local_20 = in_EDX + local_18 * -4;
  if (local_20 == 0) {
    local_18 = local_18 * local_1c;
    local_1c = 1;
  }
  local_10 = in_RSI;
  Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed4);
  pfVar1 = Mat::operator_cast_to_float_(&local_70);
  Mat::~Mat((Mat *)0x17b5ec);
  local_28 = pfVar1;
  Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed4);
  pfVar1 = Mat::operator_cast_to_float_(&local_c0);
  Mat::~Mat((Mat *)0x17b631);
  local_78 = pfVar1;
  Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               in_stack_fffffffffffffed4);
  pfVar1 = Mat::operator_cast_to_float_(&local_110);
  Mat::~Mat((Mat *)0x17b66e);
  local_c8 = pfVar1;
  for (local_114 = 0; local_114 < local_1c; local_114 = local_114 + 1) {
    for (local_118 = local_18; 0 < local_118; local_118 = local_118 + -1) {
      local_11c = (int)*local_28;
      local_120 = 0;
      piVar2 = std::max<int>(&local_11c,&local_120);
      piVar2 = std::min<int>(piVar2,(int *)&stack0xfffffffffffffedc);
      *local_10 = (char)*piVar2;
      piVar2 = std::max<int>((int *)&stack0xfffffffffffffed8,(int *)&stack0xfffffffffffffed4);
      local_130 = 0xff;
      piVar2 = std::min<int>(piVar2,&local_130);
      local_10[1] = (char)*piVar2;
      local_13c[2] = (int)*local_c8;
      local_13c[1] = 0;
      piVar2 = std::max<int>(local_13c + 2,local_13c + 1);
      local_13c[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_13c);
      local_10[2] = (char)*piVar2;
      local_10[3] = 0xff;
      local_10 = local_10 + 4;
      local_28 = local_28 + 1;
      local_78 = local_78 + 1;
      local_c8 = local_c8 + 1;
    }
    local_10 = local_10 + local_20;
  }
  return;
}

Assistant:

static void to_rgb2rgba(const Mat& m, unsigned char* rgba, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 4;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);

    for (int y = 0; y < h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
        uint8x8_t _a = vdup_n_u8(255);
        for (; nn > 0; nn--)
        {
            float32x4_t _rlow = vld1q_f32(ptr0);
            float32x4_t _rhigh = vld1q_f32(ptr0 + 4);
            float32x4_t _glow = vld1q_f32(ptr1);
            float32x4_t _ghigh = vld1q_f32(ptr1 + 4);
            float32x4_t _blow = vld1q_f32(ptr2);
            float32x4_t _bhigh = vld1q_f32(ptr2 + 4);

            int16x8_t _r16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_rlow)), vmovn_s32(vcvtq_s32_f32(_rhigh)));
            int16x8_t _g16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_glow)), vmovn_s32(vcvtq_s32_f32(_ghigh)));
            int16x8_t _b16 = vcombine_s16(vmovn_s32(vcvtq_s32_f32(_blow)), vmovn_s32(vcvtq_s32_f32(_bhigh)));

            uint8x8x4_t _rgba;
            _rgba.val[0] = vqmovun_s16(_r16);
            _rgba.val[1] = vqmovun_s16(_g16);
            _rgba.val[2] = vqmovun_s16(_b16);
            _rgba.val[3] = _a;

            vst4_u8(rgba, _rgba);

            rgba += 4 * 8;
            ptr0 += 8;
            ptr1 += 8;
            ptr2 += 8;
        }
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            rgba[0] = SATURATE_CAST_UCHAR(*ptr0);
            rgba[1] = SATURATE_CAST_UCHAR(*ptr1);
            rgba[2] = SATURATE_CAST_UCHAR(*ptr2);
            rgba[3] = 255;

            rgba += 4;
            ptr0++;
            ptr1++;
            ptr2++;
        }

#undef SATURATE_CAST_UCHAR
        rgba += wgap;
    }
}